

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# math.c
# Opt level: O1

Expr eq(pExecutor exec,pContext_conflict defContext,pContext_conflict callContext,Expr *args,
       int argc)

{
  _Bool _Var1;
  char *__s;
  Expr EVar2;
  Expr EVar3;
  Expr expr;
  Expr b;
  Expr a;
  
  if (argc < 2) {
    __s = "eq: too few arguments";
  }
  else {
    if (argc == 2) {
      EVar3._4_4_ = 0;
      EVar3.type = args->type;
      EVar3.field_1.val_atom = (args->field_1).val_atom;
      EVar2 = exec_eval(exec,callContext,EVar3);
      expr._4_4_ = 0;
      expr.type = args[1].type;
      expr.field_1.val_atom = args[1].field_1.val_atom;
      EVar3 = exec_eval(exec,callContext,expr);
      a._4_4_ = 0;
      a.type = EVar2.type;
      b._4_4_ = 0;
      b.type = EVar3.type;
      b.field_1.val_atom = EVar3.field_1.val_atom;
      a.field_1.val_atom = EVar2.field_1.val_atom;
      _Var1 = is_equal(a,b);
      EVar2._4_4_ = 0;
      EVar2.type = (&exec->nil)[_Var1].type;
      EVar2.field_1.val_atom = (&exec->nil)[_Var1].field_1.val_atom;
      return EVar2;
    }
    __s = "eq: too many arguments";
  }
  puts(__s);
  exit(1);
}

Assistant:

BUILTIN_FUNC(eq)
{
    if (argc < 2)
    {
        log("eq: too few arguments");
        exit(1);
    }
    if (argc > 2)
    {
        log("eq: too many arguments");
        exit(1);
    }
    Expr a = exec_eval(exec, callContext, args[0]);
    Expr b = exec_eval(exec, callContext, args[1]);
    if (is_equal(a, b))
        return exec->t;
    else
        return exec->nil;
}